

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxid.h
# Opt level: O3

void __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::left4(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,int n,SPxId id)

{
  int iVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar4;
  long lVar5;
  cpp_dec_float<200U,_int,_void> *pcVar6;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  pointer pnVar9;
  ulong uVar10;
  byte bVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> uu;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhov_1;
  cpp_dec_float<200U,_int,_void> local_2b8;
  cpp_dec_float<200U,_int,_void> local_238;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar11 = 0;
  if (id.super_DataKey.info != 0) {
    pSVar2 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_238.fpclass = cpp_dec_float_finite;
    local_238.prec_elem = 0x1c;
    local_238.data._M_elems[0] = 0;
    local_238.data._M_elems[1] = 0;
    local_238.data._M_elems[2] = 0;
    local_238.data._M_elems[3] = 0;
    local_238.data._M_elems[4] = 0;
    local_238.data._M_elems[5] = 0;
    local_238.data._M_elems[6] = 0;
    local_238.data._M_elems[7] = 0;
    local_238.data._M_elems[8] = 0;
    local_238.data._M_elems[9] = 0;
    local_238.data._M_elems[10] = 0;
    local_238.data._M_elems[0xb] = 0;
    local_238.data._M_elems[0xc] = 0;
    local_238.data._M_elems[0xd] = 0;
    local_238.data._M_elems[0xe] = 0;
    local_238.data._M_elems[0xf] = 0;
    local_238.data._M_elems[0x10] = 0;
    local_238.data._M_elems[0x11] = 0;
    local_238.data._M_elems[0x12] = 0;
    local_238.data._M_elems[0x13] = 0;
    local_238.data._M_elems[0x14] = 0;
    local_238.data._M_elems[0x15] = 0;
    local_238.data._M_elems[0x16] = 0;
    local_238.data._M_elems[0x17] = 0;
    local_238.data._M_elems[0x18] = 0;
    local_238.data._M_elems[0x19] = 0;
    local_238.data._M_elems._104_5_ = 0;
    local_238.data._M_elems[0x1b]._1_3_ = 0;
    local_238.exp = 0;
    local_238.neg = false;
    pnVar3 = (pSVar2->theFvec->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_b8.fpclass = cpp_dec_float_finite;
    local_b8.prec_elem = 0x1c;
    local_b8.data._M_elems[0] = 0;
    local_b8.data._M_elems[1] = 0;
    local_b8.data._M_elems[2] = 0;
    local_b8.data._M_elems[3] = 0;
    local_b8.data._M_elems[4] = 0;
    local_b8.data._M_elems[5] = 0;
    local_b8.data._M_elems[6] = 0;
    local_b8.data._M_elems[7] = 0;
    local_b8.data._M_elems[8] = 0;
    local_b8.data._M_elems[9] = 0;
    local_b8.data._M_elems[10] = 0;
    local_b8.data._M_elems[0xb] = 0;
    local_b8.data._M_elems[0xc] = 0;
    local_b8.data._M_elems[0xd] = 0;
    local_b8.data._M_elems[0xe] = 0;
    local_b8.data._M_elems[0xf] = 0;
    local_b8.data._M_elems[0x10] = 0;
    local_b8.data._M_elems[0x11] = 0;
    local_b8.data._M_elems[0x12] = 0;
    local_b8.data._M_elems[0x13] = 0;
    local_b8.data._M_elems[0x14] = 0;
    local_b8.data._M_elems[0x15] = 0;
    local_b8.data._M_elems[0x16] = 0;
    local_b8.data._M_elems[0x17] = 0;
    local_b8.data._M_elems[0x18] = 0;
    local_b8.data._M_elems[0x19] = 0;
    local_b8.data._M_elems._104_5_ = 0;
    local_b8.data._M_elems[0x1b]._1_3_ = 0;
    local_b8.exp = 0;
    local_b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_138,1,(type *)0x0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_b8,&local_138,&pnVar3[n].m_backend);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::length2((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_2b8,
              &((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->theCoPvec->thedelta);
    pcVar7 = &local_2b8;
    pcVar6 = &local_1b8;
    for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pcVar6->data)._M_elems[0] = (pcVar7->data)._M_elems[0];
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar11 * -8 + 4);
      pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + (ulong)bVar11 * -8 + 4);
    }
    local_1b8.exp = local_2b8.exp;
    local_1b8.neg = local_2b8.neg;
    local_1b8.fpclass = local_2b8.fpclass;
    local_1b8.prec_elem = local_2b8.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&local_1b8,&local_b8);
    pcVar7 = &local_1b8;
    pcVar6 = &local_138;
    for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pcVar6->data)._M_elems[0] = (pcVar7->data)._M_elems[0];
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar11 * -8 + 4);
      pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + (ulong)bVar11 * -8 + 4);
    }
    local_138.exp = local_1b8.exp;
    local_138.neg = local_1b8.neg;
    local_138.fpclass = local_1b8.fpclass;
    local_138.prec_elem = local_1b8.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&local_138,&local_b8);
    pUVar4 = ((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->theFvec;
    lVar5 = (long)(pUVar4->thedelta).super_IdxSet.num;
    if (0 < lVar5) {
      uVar10 = lVar5 + 1;
      do {
        iVar1 = (pUVar4->thedelta).super_IdxSet.idx[uVar10 - 2];
        pcVar7 = &pnVar3[iVar1].m_backend;
        local_2b8.fpclass = cpp_dec_float_finite;
        local_2b8.prec_elem = 0x1c;
        local_2b8.data._M_elems[0] = 0;
        local_2b8.data._M_elems[1] = 0;
        local_2b8.data._M_elems[2] = 0;
        local_2b8.data._M_elems[3] = 0;
        local_2b8.data._M_elems[4] = 0;
        local_2b8.data._M_elems[5] = 0;
        local_2b8.data._M_elems[6] = 0;
        local_2b8.data._M_elems[7] = 0;
        local_2b8.data._M_elems[8] = 0;
        local_2b8.data._M_elems[9] = 0;
        local_2b8.data._M_elems[10] = 0;
        local_2b8.data._M_elems[0xb] = 0;
        local_2b8.data._M_elems[0xc] = 0;
        local_2b8.data._M_elems[0xd] = 0;
        local_2b8.data._M_elems[0xe] = 0;
        local_2b8.data._M_elems[0xf] = 0;
        local_2b8.data._M_elems[0x10] = 0;
        local_2b8.data._M_elems[0x11] = 0;
        local_2b8.data._M_elems[0x12] = 0;
        local_2b8.data._M_elems[0x13] = 0;
        local_2b8.data._M_elems[0x14] = 0;
        local_2b8.data._M_elems[0x15] = 0;
        local_2b8.data._M_elems[0x16] = 0;
        local_2b8.data._M_elems[0x17] = 0;
        local_2b8.data._M_elems[0x18] = 0;
        local_2b8.data._M_elems[0x19] = 0;
        local_2b8.data._M_elems._104_5_ = 0;
        local_2b8.data._M_elems[0x1b]._1_3_ = 0;
        local_2b8.exp = 0;
        local_2b8.neg = false;
        if (&local_2b8 != pcVar7) {
          pcVar6 = pcVar7;
          pcVar8 = &local_2b8;
          for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
            (pcVar8->data)._M_elems[0] = (pcVar6->data)._M_elems[0];
            pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + (ulong)bVar11 * -8 + 4);
            pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar11 * -8 + 4);
          }
          local_2b8.exp = pcVar7->exp;
          local_2b8.neg = pcVar7->neg;
          local_2b8.fpclass = pcVar7->fpclass;
          local_2b8.prec_elem = pcVar7->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_2b8,pcVar7);
        pcVar7 = &local_2b8;
        pcVar6 = &local_1b8;
        for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pcVar6->data)._M_elems[0] = (pcVar7->data)._M_elems[0];
          pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar11 * -8 + 4);
          pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + (ulong)bVar11 * -8 + 4);
        }
        local_1b8.exp = local_2b8.exp;
        local_1b8.neg = local_2b8.neg;
        local_1b8.fpclass = local_2b8.fpclass;
        local_1b8.prec_elem = local_2b8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_1b8,&local_138);
        pcVar7 = &local_1b8;
        pcVar6 = &local_238;
        for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pcVar6->data)._M_elems[0] = (pcVar7->data)._M_elems[0];
          pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar11 * -8 + 4);
          pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + (ulong)bVar11 * -8 + 4);
        }
        local_238.exp = local_1b8.exp;
        local_238.neg = local_1b8.neg;
        local_238.fpclass = local_1b8.fpclass;
        local_238.prec_elem = local_1b8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&(pSVar2->coWeights).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend,&local_238);
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
    }
    pnVar3 = (pSVar2->coWeights).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar7 = &local_138;
    pnVar9 = pnVar3 + n;
    for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + ((ulong)bVar11 * -2 + 1) * 4);
      pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar11 * -2 + 1) * 4);
    }
    pnVar3[n].m_backend.exp = local_138.exp;
    pnVar3[n].m_backend.neg = local_138.neg;
    pnVar3[n].m_backend.fpclass = local_138.fpclass;
    pnVar3[n].m_backend.prec_elem = local_138.prec_elem;
  }
  return;
}

Assistant:

inline bool isValid() const
   {
      return info != 0;
   }